

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O3

char * TxtReplace(char *in_str,char *in_substr,char *out_substr,int recurse)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *__haystack;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar13;
  int iVar14;
  int iVar12;
  
  if (in_str == (char *)0x0) {
    __haystack = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_str);
    sVar2 = strlen(in_substr);
    iVar7 = (int)sVar1;
    iVar9 = (int)sVar2;
    __haystack = in_str;
    if (iVar9 != 0 && iVar7 != 0) {
      sVar1 = strlen(out_substr);
      pcVar3 = strstr(in_str,in_substr);
      iVar12 = (int)sVar1;
      uVar11 = iVar12 - iVar9;
      if (uVar11 == 0 || iVar12 < iVar9) {
        if (pcVar3 != (char *)0x0) {
          sVar1 = (size_t)iVar12;
          do {
            if (iVar12 != 0) {
              memcpy(pcVar3,out_substr,sVar1);
            }
            if (iVar12 != iVar9) {
              pcVar4 = pcVar3 + sVar1;
              cVar5 = pcVar3[iVar9];
              if (cVar5 != '\0') {
                pcVar6 = pcVar3 + (long)iVar9 + 1;
                do {
                  *pcVar4 = cVar5;
                  pcVar4 = pcVar4 + 1;
                  cVar5 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while (cVar5 != '\0');
              }
              *pcVar4 = '\0';
            }
            pcVar3 = pcVar3 + sVar1;
            if (recurse != 0) {
              pcVar3 = in_str;
            }
            pcVar3 = strstr(pcVar3,in_substr);
          } while (pcVar3 != (char *)0x0);
        }
      }
      else if (pcVar3 != (char *)0x0) {
        iVar10 = iVar7 + 1;
        iVar14 = 0;
        do {
          iVar14 = iVar14 + 1;
          pcVar3 = strstr(pcVar3 + iVar9,in_substr);
          iVar10 = iVar10 + uVar11;
        } while (pcVar3 != (char *)0x0);
        __haystack = (char *)realloc(in_str,(long)iVar10);
        pcVar3 = strstr(__haystack,in_substr);
        if (pcVar3 != (char *)0x0) {
          uVar13 = (ulong)uVar11;
          lVar8 = (long)iVar7;
          do {
            for (pcVar4 = __haystack + lVar8; pcVar4 != pcVar3 + ((long)iVar9 - uVar13);
                pcVar4 = pcVar4 + -1) {
              pcVar4[uVar13] = *pcVar4;
            }
            memcpy(pcVar3,out_substr,(long)iVar12);
            pcVar3 = pcVar3 + iVar12;
            if (recurse != 0) {
              pcVar3 = in_str;
            }
            pcVar3 = strstr(pcVar3,in_substr);
            if (pcVar3 == (char *)0x0) break;
            lVar8 = lVar8 + uVar13;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          if (pcVar3 != (char *)0x0) {
            printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can\'t use this one!\n"
                   ,in_substr,out_substr);
            exit(7);
          }
        }
      }
    }
  }
  return __haystack;
}

Assistant:

char *TxtReplace(char *in_str, char *in_substr, char *out_substr, int recurse)
{
	#undef FUNC
	#define FUNC "TxtReplace"
	
	char *str_look,*m1,*m2;
	char *out_str;
	int sl,l1,l2,dif,cpt;

	if (in_str==NULL)
		return NULL;
		
	sl=strlen(in_str);
	l1=strlen(in_substr);
	/* empty string, nothing to do except return empty string */
	if (!sl || !l1)
		return in_str;
		
	l2=strlen(out_substr);
	dif=l2-l1;
		
	/* replace string is small or equal in size, we dont realloc */
	if (dif<=0)
	{
		/* we loop while there is a replace to do */
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			/*logdebug(str_look);*/
			
			/* we copy the new string if his len is not null */
			if (l2)
				memcpy(str_look,out_substr,l2);
			/* only if len are different */
			if (l1!=l2)
			{
				/* we move the end of the string byte per byte
				   because memory locations overlap. This is
				   faster than memmove */
				m1=str_look+l1;
				m2=str_look+l2;
				while (*m1!=0)
				{
					*m2=*m1;
					m1++;m2++;
				}
				/* we must copy the EOL */
				*m2=*m1;
			}
			/* look for next replace */
			if (!recurse)
				str_look=strstr(str_look+l2,in_substr);
			else
				str_look=strstr(in_str,in_substr);
		}
		out_str=in_str;
	}
	else
	{
		/* we need to count each replace */
		cpt=0;
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			cpt++;
			str_look=strstr(str_look+l1,in_substr);
		}
		/* is there anything to do? */
		if (cpt)
		{
			/* we realloc to a size that will fit all replaces */
			out_str=MemRealloc(in_str,sl+1+dif*cpt);
			str_look=strstr(out_str,in_substr);
			while (str_look!=NULL && cpt)
			{
				/* as the replace string is bigger we
				   have to move memory first from the end */
				m1=out_str+sl;
				m2=m1+dif;
				sl+=dif;
				while (m1!=str_look+l1-dif)
				{
					*m2=*m1;
					m1--;m2--;
				}
				/* then we copy the replace string (can't be NULL in this case) */
				memcpy(str_look,out_substr,l2);
				
				/* look for next replace */
				if (!recurse)
					str_look=strstr(str_look+l2,in_substr);
				else
					str_look=strstr(in_str,in_substr);
					
				/* to prevent from naughty overlap */
				cpt--;
			}
			if (str_look!=NULL)
			{
				printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can't use this one!\n",in_substr,out_substr);
				exit(ABORT_ERROR);
			}
		}
		else
			out_str=in_str;
	}
	return out_str;
}